

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetActiveID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiInputSource IVar2;
  bool bVar3;
  
  pIVar1 = GImGui;
  bVar3 = GImGui->ActiveId != id;
  GImGui->ActiveIdIsJustActivated = bVar3;
  if (bVar3) {
    pIVar1->ActiveIdTimer = 0.0;
  }
  pIVar1->ActiveId = id;
  pIVar1->ActiveIdAllowNavDirFlags = 0;
  pIVar1->ActiveIdAllowOverlap = false;
  pIVar1->ActiveIdWindow = window;
  if (id != 0) {
    pIVar1->ActiveIdIsAlive = true;
    IVar2 = ImGuiInputSource_Nav;
    if (((pIVar1->NavActivateId != id) && (pIVar1->NavInputId != id)) &&
       (pIVar1->NavJustTabbedId != id)) {
      IVar2 = (pIVar1->NavJustMovedToId == id) + ImGuiInputSource_Mouse;
    }
    pIVar1->ActiveIdSource = IVar2;
  }
  return;
}

Assistant:

void ImGui::SetActiveID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    g.ActiveIdIsJustActivated = (g.ActiveId != id);
    if (g.ActiveIdIsJustActivated)
        g.ActiveIdTimer = 0.0f;
    g.ActiveId = id;
    g.ActiveIdAllowNavDirFlags = 0;
    g.ActiveIdAllowOverlap = false;
    g.ActiveIdWindow = window;
    if (id)
    {
        g.ActiveIdIsAlive = true;
        g.ActiveIdSource = (g.NavActivateId == id || g.NavInputId == id || g.NavJustTabbedId == id || g.NavJustMovedToId == id) ? ImGuiInputSource_Nav : ImGuiInputSource_Mouse;
    }
}